

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concurrent_index.cpp
# Opt level: O2

void MixUpdatePK(DuckDB *db,idx_t thread_idx)

{
  char cVar1;
  result_type rVar2;
  result_type rVar3;
  pointer pMVar4;
  pointer *__ptr;
  long lVar5;
  bool bVar6;
  _Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false> local_1488;
  uniform_int_distribution<int> distribution;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1478;
  Connection con;
  string local_1438;
  string local_1418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13d8;
  mt19937 gen;
  
  distribution._M_param._M_a = 1;
  distribution._M_param._M_b = 100;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&gen);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&gen,thread_idx);
  duckdb::Connection::Connection(&con,db);
  lVar5 = 100;
  while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
    rVar2 = std::uniform_int_distribution<int>::operator()(&distribution,&gen);
    rVar3 = std::uniform_int_distribution<int>::operator()(&distribution,&gen);
    std::__cxx11::to_string(&local_1418,(long)(rVar3 + 100));
    std::operator+(&local_13f8,"UPDATE integers SET i =",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1418)
    ;
    std::operator+(&local_1478,&local_13f8," WHERE i = ");
    std::__cxx11::to_string(&local_1438,(long)rVar2);
    std::operator+(&local_13d8,&local_1478,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1438)
    ;
    duckdb::Connection::Query((string *)&local_1488);
    std::__cxx11::string::~string((string *)&local_13d8);
    std::__cxx11::string::~string((string *)&local_1438);
    std::__cxx11::string::~string((string *)&local_1478);
    std::__cxx11::string::~string((string *)&local_13f8);
    std::__cxx11::string::~string((string *)&local_1418);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)&local_1488);
    cVar1 = duckdb::BaseQueryResult::HasError();
    if (cVar1 != '\0') {
      pMVar4 = duckdb::
               unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
               ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                             *)&local_1488);
      (**(code **)(*(long *)pMVar4 + 0x20))(&local_13d8,pMVar4);
      CheckConstraintViolation((string *)&local_13d8);
      std::__cxx11::string::~string((string *)&local_13d8);
    }
    if (local_1488._M_head_impl != (MaterializedQueryResult *)0x0) {
      (**(code **)(*(long *)local_1488._M_head_impl + 8))();
    }
  }
  duckdb::Connection::~Connection(&con);
  return;
}

Assistant:

static void MixUpdatePK(DuckDB *db, idx_t thread_idx) {

	std::uniform_int_distribution<> distribution(1, 100);
	std::mt19937 gen;
	gen.seed(thread_idx);

	Connection con(*db);
	for (idx_t i = 0; i < 100; i++) {

		idx_t old_value = distribution(gen);
		idx_t new_value = 100 + distribution(gen);

		auto result =
		    con.Query("UPDATE integers SET i =" + to_string(new_value) + " WHERE i = " + to_string(old_value));
		if (result->HasError()) {
			CheckConstraintViolation(result->ToString());
		}
	}
}